

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O2

void end_dump(int how,char *killbuf,char *pbuf,long umoney)

{
  int iVar1;
  int iVar2;
  
  if (dumpfp != (FILE *)0x0) {
    fwrite("Latest messages:\n",0x11,1,(FILE *)dumpfp);
    for (iVar2 = 0; iVar2 != 0x1e; iVar2 = iVar2 + 1) {
      iVar1 = (curline + iVar2) % 0x1e;
      if (toplines[iVar1][0] != '\0') {
        if (toplines_count[iVar1] == 1) {
          fprintf((FILE *)dumpfp,"  %s\n",toplines + iVar1);
        }
        else {
          fprintf((FILE *)dumpfp,"  %s (%dx)\n",toplines + iVar1);
        }
      }
    }
    fputc(10,(FILE *)dumpfp);
    windowprocs.win_display_menu = dump_display_menu;
    windowprocs.win_display_objects = dump_display_objects;
    windowprocs.win_outrip = dump_outrip;
    display_rip(how,killbuf,pbuf,umoney);
    memcpy(&windowprocs,&winprocs_original,0x90);
    fclose((FILE *)dumpfp);
    return;
  }
  return;
}

Assistant:

void end_dump(int how, char *killbuf, char *pbuf, long umoney)
{
    int i, line;
    if (!dumpfp)
	return;
    
    fprintf(dumpfp, "Latest messages:\n");
    for (i = 0; i < MSGCOUNT; i++) {
	line = (curline + i) % MSGCOUNT;
	if (toplines[line][0]) {
	    if (toplines_count[line] == 1) {
		fprintf(dumpfp, "  %s\n", toplines[line]);
	    } else {
		fprintf(dumpfp, "  %s (%dx)\n", toplines[line],
			toplines_count[line]);
	    }
	}
    }
    fprintf(dumpfp, "\n");
    
    dump_catch_menus(TRUE);
    display_rip(how, killbuf, pbuf, umoney);
    dump_catch_menus(FALSE);
    
    fclose(dumpfp);
}